

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O0

string * __thiscall
chaiscript::AST_Node_Trace::pretty_print_abi_cxx11_
          (string *__return_storage_ptr__,AST_Node_Trace *this)

{
  bool bVar1;
  ostream *poVar2;
  string local_1e0;
  reference local_1c0;
  AST_Node_Trace *elem;
  const_iterator __end2;
  const_iterator __begin2;
  vector<chaiscript::AST_Node_Trace,_std::allocator<chaiscript::AST_Node_Trace>_> *__range2;
  ostringstream local_190 [8];
  ostringstream oss;
  AST_Node_Trace *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::operator<<((ostream *)local_190,(string *)&this->text);
  __end2 = std::vector<chaiscript::AST_Node_Trace,_std::allocator<chaiscript::AST_Node_Trace>_>::
           begin(&this->children);
  elem = (AST_Node_Trace *)
         std::vector<chaiscript::AST_Node_Trace,_std::allocator<chaiscript::AST_Node_Trace>_>::end
                   (&this->children);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_chaiscript::AST_Node_Trace_*,_std::vector<chaiscript::AST_Node_Trace,_std::allocator<chaiscript::AST_Node_Trace>_>_>
                      (&__end2,(__normal_iterator<const_chaiscript::AST_Node_Trace_*,_std::vector<chaiscript::AST_Node_Trace,_std::allocator<chaiscript::AST_Node_Trace>_>_>
                                *)&elem);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_1c0 = __gnu_cxx::
                __normal_iterator<const_chaiscript::AST_Node_Trace_*,_std::vector<chaiscript::AST_Node_Trace,_std::allocator<chaiscript::AST_Node_Trace>_>_>
                ::operator*(&__end2);
    pretty_print_abi_cxx11_(&local_1e0,local_1c0);
    poVar2 = std::operator<<((ostream *)local_190,(string *)&local_1e0);
    std::operator<<(poVar2,' ');
    std::__cxx11::string::~string((string *)&local_1e0);
    __gnu_cxx::
    __normal_iterator<const_chaiscript::AST_Node_Trace_*,_std::vector<chaiscript::AST_Node_Trace,_std::allocator<chaiscript::AST_Node_Trace>_>_>
    ::operator++(&__end2);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string pretty_print() const {
      std::ostringstream oss;

      oss << text;

      for (const auto &elem : children) {
        oss << elem.pretty_print() << ' ';
      }

      return oss.str();
    }